

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_add(mp_int *x,mp_int *y)

{
  size_t sVar1;
  mp_int *r_00;
  mp_int *r;
  mp_int *y_local;
  mp_int *x_local;
  
  sVar1 = size_t_max(x->nw,y->nw);
  r_00 = mp_make_sized(sVar1 + 1);
  mp_add_into(r_00,x,y);
  return r_00;
}

Assistant:

mp_int *mp_add(mp_int *x, mp_int *y)
{
    mp_int *r = mp_make_sized(size_t_max(x->nw, y->nw) + 1);
    mp_add_into(r, x, y);
    return r;
}